

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_windows.cpp
# Opt level: O2

void install_attributes(XSetWindowAttributes *attrib,unsigned_long *attrib_value_mask,
                       Am_Drawonable_Impl *d,Screen_Desc *the_screen,Am_Style *back_color,
                       bool save_under_flag,bool title_bar_flag,long event_mask)

{
  ulong uVar1;
  bool bVar2;
  Am_Wrapper *value;
  Am_Style_Data *this;
  unsigned_long uVar3;
  
  *attrib_value_mask = 0;
  value = Am_Style::operator_cast_to_Am_Wrapper_(back_color);
  this = Am_Style_Data::Narrow(value);
  bVar2 = Am_Style::operator==(back_color,&Am_No_Style);
  if (bVar2) {
    uVar3 = the_screen->whitepixel;
  }
  else {
    uVar3 = Am_Style_Data::Get_X_Index(this,d);
  }
  attrib->background_pixel = uVar3;
  if (this != (Am_Style_Data *)0x0) {
    Am_Wrapper::Release(&this->super_Am_Wrapper);
  }
  *(byte *)attrib_value_mask = (byte)*attrib_value_mask | 2;
  attrib->event_mask = event_mask;
  uVar1 = *attrib_value_mask;
  attrib->save_under = (uint)save_under_flag;
  attrib->override_redirect = (uint)!title_bar_flag;
  *attrib_value_mask = uVar1 | 0xe00;
  return;
}

Assistant:

void
install_attributes(XSetWindowAttributes *attrib,
                   unsigned long *attrib_value_mask, Am_Drawonable_Impl *d,
                   Screen_Desc *the_screen, Am_Style back_color,
                   bool save_under_flag, bool title_bar_flag, long event_mask)
{
  *attrib_value_mask = 0;

  Am_Style_Data *b_color = Am_Style_Data::Narrow(back_color);
  // Install background color in attribute structure
  if (back_color == Am_No_Style)
    attrib->background_pixel = the_screen->whitepixel;
  else
    attrib->background_pixel = b_color->Get_X_Index(d);
  if (b_color)
    b_color->Release();
  *attrib_value_mask |= CWBackPixel;

  // Set event mask for input handling
  attrib->event_mask = event_mask;
  *attrib_value_mask |= CWEventMask;

  // Set save-under flag
  attrib->save_under = save_under_flag;
  *attrib_value_mask |= CWSaveUnder;

  // Set whether window-manager should provide title-bar
  attrib->override_redirect = !(title_bar_flag);
  *attrib_value_mask |= CWOverrideRedirect;
}